

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cached-powers.cc
# Opt level: O1

void double_conversion::PowersOfTenCache::GetCachedPowerForDecimalExponent
               (int requested_exponent,DiyFp *power,int *found_exponent)

{
  short sVar1;
  short sVar2;
  long lVar3;
  int iVar4;
  
  iVar4 = requested_exponent + 0x163;
  if (-1 < requested_exponent + 0x15c) {
    iVar4 = requested_exponent + 0x15c;
  }
  lVar3 = (long)(iVar4 >> 3) * 0x10;
  sVar1 = *(short *)(kCachedPowers + lVar3 + 8);
  sVar2 = *(short *)(kCachedPowers + lVar3 + 10);
  power->f_ = *(uint64_t *)(kCachedPowers + lVar3);
  power->e_ = (int)sVar1;
  *found_exponent = (int)sVar2;
  return;
}

Assistant:

void GetCachedPowerForDecimalExponent(int requested_exponent,
                                      DiyFp* power,
                                      int* found_exponent) {
  DOUBLE_CONVERSION_ASSERT(kMinDecimalExponent <= requested_exponent);
  DOUBLE_CONVERSION_ASSERT(requested_exponent < kMaxDecimalExponent + kDecimalExponentDistance);
  int index =
      (requested_exponent + kCachedPowersOffset) / kDecimalExponentDistance;
  CachedPower cached_power = kCachedPowers[index];
  *power = DiyFp(cached_power.significand, cached_power.binary_exponent);
  *found_exponent = cached_power.decimal_exponent;
  DOUBLE_CONVERSION_ASSERT(*found_exponent <= requested_exponent);
  DOUBLE_CONVERSION_ASSERT(requested_exponent < *found_exponent + kDecimalExponentDistance);
}